

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

DPIImportSyntax * __thiscall
slang::parsing::Parser::parseDPIImport(Parser *this,AttrList attributes)

{
  bool bVar1;
  undefined8 uVar2;
  FunctionPrototypeSyntax *method;
  Diagnostic *this_00;
  DPIImportSyntax *pDVar3;
  Token specString;
  Token keyword;
  Token TVar4;
  SourceRange SVar5;
  Token local_c0;
  undefined8 local_b0;
  pointer local_a8;
  Info *local_a0;
  Token local_98;
  Token local_88;
  Token local_78;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_68;
  
  local_a8 = attributes._M_ptr;
  keyword = ParserBase::consume(&this->super_ParserBase);
  TVar4 = parseDPISpecString(this);
  local_a0 = TVar4.info;
  uVar2 = TVar4._0_8_;
  Token::Token(&local_c0);
  bVar1 = ParserBase::peek(&this->super_ParserBase,ContextKeyword);
  if (!bVar1) {
    bVar1 = ParserBase::peek(&this->super_ParserBase,PureKeyword);
    if (!bVar1) goto LAB_001f08d9;
  }
  local_c0 = ParserBase::consume(&this->super_ParserBase);
LAB_001f08d9:
  Token::Token(&local_88);
  Token::Token(&local_98);
  bVar1 = ParserBase::peek(&this->super_ParserBase,Identifier);
  if (bVar1) {
    local_88 = ParserBase::consume(&this->super_ParserBase);
    local_98 = ParserBase::expect(&this->super_ParserBase,Equals);
  }
  method = parseFunctionPrototype
                     (this,Unknown,(bitmask<slang::parsing::detail::FunctionOptions>)0x3,(bool *)0x0
                     );
  if ((local_c0.kind == PureKeyword) && ((method->keyword).kind == TaskKeyword)) {
    SVar5 = Token::range(&method->keyword);
    this_00 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xc30005,SVar5);
    local_b0 = uVar2;
    SVar5 = Token::range(&local_c0);
    uVar2 = local_b0;
    Diagnostic::operator<<(this_00,SVar5);
  }
  local_78 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       local_a8;
  local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_0062f0b8;
  specString.info = local_a0;
  specString.kind = (short)uVar2;
  specString._2_1_ = (char)((ulong)uVar2 >> 0x10);
  specString.numFlags.raw = (char)((ulong)uVar2 >> 0x18);
  specString.rawLen = (int)((ulong)uVar2 >> 0x20);
  local_68.super_SyntaxListBase.childCount = attributes._M_extent._M_extent_value._M_extent_value;
  local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = attributes._M_extent._M_extent_value._M_extent_value;
  pDVar3 = slang::syntax::SyntaxFactory::dPIImport
                     (&this->factory,&local_68,keyword,specString,local_c0,local_88,local_98,method,
                      local_78);
  return pDVar3;
}

Assistant:

DPIImportSyntax& Parser::parseDPIImport(AttrList attributes) {
    Token keyword = consume();
    Token specString = parseDPISpecString();

    Token property;
    if (peek(TokenKind::ContextKeyword) || peek(TokenKind::PureKeyword))
        property = consume();

    Token c_identifier, equals;
    if (peek(TokenKind::Identifier)) {
        c_identifier = consume();
        equals = expect(TokenKind::Equals);
    }

    auto& method = parseFunctionPrototype(
        SyntaxKind::Unknown, FunctionOptions::AllowImplicitReturn | FunctionOptions::IsPrototype);

    if (property.kind == TokenKind::PureKeyword && method.keyword.kind == TokenKind::TaskKeyword)
        addDiag(diag::DPIPureTask, method.keyword.range()) << property.range();

    Token semi = expect(TokenKind::Semicolon);
    return factory.dPIImport(attributes, keyword, specString, property, c_identifier, equals,
                             method, semi);
}